

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::UnitTestImpl(UnitTestImpl *this,UnitTest *parent)

{
  _Rb_tree_header *p_Var1;
  pthread_key_t pVar2;
  ValueHolderFactory *pVVar3;
  TestEventRepeater *pTVar4;
  DeathTestFactory *pDVar5;
  ValueHolderFactory *pVVar6;
  TestEventListener *listener;
  
  this->_vptr_UnitTestImpl = (_func_int **)&PTR__UnitTestImpl_00177088;
  this->parent_ = parent;
  (this->original_working_dir_).pathname_._M_dataplus._M_p =
       (pointer)&(this->original_working_dir_).pathname_.field_2;
  (this->original_working_dir_).pathname_._M_string_length = 0;
  (this->original_working_dir_).pathname_.field_2._M_local_buf[0] = '\0';
  (this->default_global_test_part_result_reporter_).super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__TestPartResultReporterInterface_00176de8;
  (this->default_global_test_part_result_reporter_).unit_test_ = this;
  (this->default_per_thread_test_part_result_reporter_).super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__TestPartResultReporterInterface_00176e10;
  (this->default_per_thread_test_part_result_reporter_).unit_test_ = this;
  this->global_test_part_result_repoter_ =
       &(this->default_global_test_part_result_reporter_).super_TestPartResultReporterInterface;
  Mutex::Mutex(&this->global_test_part_result_reporter_mutex_);
  pVar2 = ThreadLocal<testing::TestPartResultReporterInterface_*>::CreateKey();
  (this->per_thread_test_part_result_reporter_).key_ = pVar2;
  pVVar3 = (ValueHolderFactory *)operator_new(0x10);
  pVVar3->_vptr_ValueHolderFactory = (_func_int **)&PTR__ValueHolderFactory_00177be0;
  pVVar3[1]._vptr_ValueHolderFactory =
       (_func_int **)&this->default_per_thread_test_part_result_reporter_;
  (this->per_thread_test_part_result_reporter_).default_factory_._M_t.
  super___uniq_ptr_impl<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory,_std::default_delete<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory_*,_std::default_delete<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory>_>
  .
  super__Head_base<0UL,_testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory_*,_false>
  ._M_head_impl = pVVar3;
  p_Var1 = &(this->type_parameterized_test_registry_).suites_._M_t._M_impl.super__Rb_tree_header;
  (this->type_parameterized_test_registry_).suites_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->type_parameterized_test_registry_).suites_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->environments_).
  super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->environments_).
  super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->environments_).
  super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->test_suites_).
  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->test_suites_).
  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->test_suites_).
  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parameterized_test_registry_).test_suite_infos_.
  super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parameterized_test_registry_).test_suite_infos_.
  super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameterized_test_registry_).test_suite_infos_.
  super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->type_parameterized_test_registry_).suites_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->type_parameterized_test_registry_).suites_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->type_parameterized_test_registry_).suites_._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0;
  p_Var1 = &(this->ignored_parameterized_test_suites_)._M_t._M_impl.super__Rb_tree_header;
  (this->ignored_parameterized_test_suites_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->ignored_parameterized_test_suites_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (this->ignored_parameterized_test_suites_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ignored_parameterized_test_suites_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ignored_parameterized_test_suites_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->parameterized_tests_registered_ = false;
  this->last_death_test_suite_ = -1;
  this->current_test_suite_ = (TestSuite *)0x0;
  this->current_test_info_ = (TestInfo *)0x0;
  Mutex::Mutex(&(this->ad_hoc_test_result_).test_properites_mutex_);
  (this->ad_hoc_test_result_).test_properties_.
  super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ad_hoc_test_result_).test_properties_.
  super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ad_hoc_test_result_).test_part_results_.
  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ad_hoc_test_result_).test_properties_.
  super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ad_hoc_test_result_).test_part_results_.
  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ad_hoc_test_result_).test_part_results_.
  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ad_hoc_test_result_).death_test_count_ = 0;
  (this->ad_hoc_test_result_).start_timestamp_ = 0;
  (this->ad_hoc_test_result_).elapsed_time_ = 0;
  pTVar4 = (TestEventRepeater *)operator_new(0x28);
  (pTVar4->super_TestEventListener)._vptr_TestEventListener =
       (_func_int **)&PTR__TestEventRepeater_00176e98;
  pTVar4->forwarding_enabled_ = true;
  (pTVar4->listeners_).
  super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar4->listeners_).
  super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar4->listeners_).
  super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->listeners_).repeater_ = pTVar4;
  this->random_seed_ = 0;
  this->random_ = 0;
  (this->listeners_).default_result_printer_ = (TestEventListener *)0x0;
  (this->listeners_).default_xml_generator_ = (TestEventListener *)0x0;
  *(undefined8 *)((long)&(this->listeners_).default_xml_generator_ + 1) = 0;
  *(undefined8 *)((long)&this->os_stack_trace_getter_ + 1) = 0;
  this->start_timestamp_ = 0;
  this->elapsed_time_ = 0;
  (this->internal_run_death_test_flag_)._M_t.
  super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
  .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl =
       (InternalRunDeathTestFlag *)0x0;
  pDVar5 = (DeathTestFactory *)operator_new(8);
  pDVar5->_vptr_DeathTestFactory = (_func_int **)&PTR__DeathTestFactory_00177380;
  (this->death_test_factory_)._M_t.
  super___uniq_ptr_impl<testing::internal::DeathTestFactory,_std::default_delete<testing::internal::DeathTestFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::DeathTestFactory_*,_std::default_delete<testing::internal::DeathTestFactory>_>
  .super__Head_base<0UL,_testing::internal::DeathTestFactory_*,_false>._M_head_impl = pDVar5;
  pVar2 = ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
          ::CreateKey();
  (this->gtest_trace_stack_).key_ = pVar2;
  pVVar6 = (ValueHolderFactory *)operator_new(8);
  pVVar6->_vptr_ValueHolderFactory = (_func_int **)&PTR__ValueHolderFactory_00177c50;
  (this->gtest_trace_stack_).default_factory_._M_t.
  super___uniq_ptr_impl<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>::ValueHolderFactory,_std::default_delete<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>::ValueHolderFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>::ValueHolderFactory_*,_std::default_delete<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>::ValueHolderFactory>_>
  .
  super__Head_base<0UL,_testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>::ValueHolderFactory_*,_false>
  ._M_head_impl = pVVar6;
  this->catch_exceptions_ = false;
  listener = (TestEventListener *)operator_new(8);
  listener->_vptr_TestEventListener = (_func_int **)&PTR__TestEventListener_001771c8;
  TestEventListeners::SetDefaultResultPrinter(&this->listeners_,listener);
  return;
}

Assistant:

UnitTestImpl::UnitTestImpl(UnitTest* parent)
    : parent_(parent),
      GTEST_DISABLE_MSC_WARNINGS_PUSH_(4355 /* using this in initializer */)
          default_global_test_part_result_reporter_(this),
      default_per_thread_test_part_result_reporter_(this),
      GTEST_DISABLE_MSC_WARNINGS_POP_() global_test_part_result_repoter_(
          &default_global_test_part_result_reporter_),
      per_thread_test_part_result_reporter_(
          &default_per_thread_test_part_result_reporter_),
      parameterized_test_registry_(),
      parameterized_tests_registered_(false),
      last_death_test_suite_(-1),
      current_test_suite_(nullptr),
      current_test_info_(nullptr),
      ad_hoc_test_result_(),
      os_stack_trace_getter_(nullptr),
      post_flag_parse_init_performed_(false),
      random_seed_(0),  // Will be overridden by the flag before first use.
      random_(0),       // Will be reseeded before first use.
      start_timestamp_(0),
      elapsed_time_(0),
#if GTEST_HAS_DEATH_TEST
      death_test_factory_(new DefaultDeathTestFactory),
#endif
      // Will be overridden by the flag before first use.
      catch_exceptions_(false) {
  listeners()->SetDefaultResultPrinter(new PrettyUnitTestResultPrinter);
}